

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Disk::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Disk *this,Point2f u)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Normal3<float> NVar16;
  Point3fi pi;
  Tuple2<pbrt::Point2,_float> local_60;
  Point3fi local_58;
  Tuple3<pbrt::Normal3,_float> local_40;
  undefined1 local_30 [16];
  Interval local_20;
  undefined1 extraout_var [56];
  undefined1 auVar12 [56];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_60 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8._0_16_);
  auVar9._0_8_ = SampleUniformDiskConcentric((Point2f *)&local_60);
  auVar9._8_56_ = extraout_var;
  FVar5 = this->height;
  auVar15._4_4_ = FVar5;
  auVar15._0_4_ = FVar5;
  auVar15._8_4_ = FVar5;
  auVar15._12_4_ = FVar5;
  fVar3 = auVar9._0_4_ * this->radius;
  auVar6 = vmovshdup_avx(auVar9._0_16_);
  fVar4 = auVar6._0_4_ * this->radius;
  auVar14._4_4_ = fVar3;
  auVar14._0_4_ = fVar3;
  auVar14._8_4_ = fVar3;
  auVar14._12_4_ = fVar3;
  auVar6._4_4_ = fVar4;
  auVar6._0_4_ = fVar4;
  auVar6._8_4_ = fVar4;
  auVar6._12_4_ = fVar4;
  local_30 = vmovlhps_avx(auVar14,auVar6);
  auVar12 = ZEXT856(local_30._8_8_);
  local_20 = (Interval)vmovlps_avx(auVar15);
  Transform::operator()(&local_58,this->renderFromObject,(Point3fi *)local_30);
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 1.0;
  NVar16 = Transform::operator()(this->renderFromObject,(Normal3<float> *)&local_40);
  auVar10._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  uVar1 = vmovlps_avx(auVar10._0_16_);
  local_30._8_4_ = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
  local_30._0_8_ = uVar1;
  NVar16 = Normalize<float>((Normal3<float> *)local_30);
  auVar11._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  auVar7 = auVar11._0_16_;
  bVar2 = this->reverseOrientation;
  if (bVar2 != false) {
    auVar7._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
    auVar7._8_4_ = auVar12._0_4_ ^ 0x80000000;
    auVar7._12_4_ = auVar12._4_4_ ^ 0x80000000;
  }
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  FVar5 = Area(this);
  __return_storage_ptr__->set = true;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar13;
  uVar1 = vmovlps_avx(auVar7);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar1;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       (uint)(bVar2 & 1) * (int)-NVar16.super_Tuple3<pbrt::Normal3,_float>.z +
       (uint)!(bool)(bVar2 & 1) * (int)NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / FVar5;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        Point2f pd = SampleUniformDiskConcentric(u);
        Point3f pObj(pd.x * radius, pd.y * radius, height);
        Point3fi pi = (*renderFromObject)(Point3fi(pObj));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(0, 0, 1)));
        if (reverseOrientation)
            n *= -1;
        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }